

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadCharCount
          (ByteCodeBufferReader *this,byte *buffer,size_t remainingBytes,charcount_t *value)

{
  byte bVar1;
  ushort uVar2;
  charcount_t cVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  char16_t *form;
  long lVar7;
  
  if (remainingBytes == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x130,"(remainingBytes >= sizeof(byte))",
                                "remainingBytes >= sizeof(byte)");
    if (!bVar5) goto LAB_00894a72;
    *puVar6 = 0;
  }
  bVar1 = *buffer;
  if (bVar1 < 0xfe) {
    *value = (uint)bVar1;
    bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,VariableIntEncodingPhase);
    lVar7 = 1;
    if (!bVar5) goto LAB_00894a5d;
    form = L"TestTrace: VariableIntEncoding (decode) - 1 byte, value %u\n";
  }
  else {
    if (remainingBytes < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x135,"(remainingBytes >= sizeof(uint16))",
                                  "remainingBytes >= sizeof(uint16)");
      if (!bVar5) goto LAB_00894a72;
      *puVar6 = 0;
    }
    if (bVar1 == 0xfe) {
      uVar2 = *(ushort *)(buffer + 1);
      if (uVar2 < 0xfe) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x13b,"(twoByteValue > ((byte) 0xfd))",
                                    "twoByteValue > ONE_BYTE_MAX");
        if (!bVar5) {
LAB_00894a72:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      *value = (uint)uVar2;
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,VariableIntEncodingPhase);
      lVar7 = 3;
      if (!bVar5) goto LAB_00894a5d;
      form = L"TestTrace: VariableIntEncoding (decode)- 2 bytes, value %u\n";
    }
    else {
      if (remainingBytes < 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x143,"(remainingBytes >= sizeof(T))",
                                    "remainingBytes >= sizeof(T)");
        if (!bVar5) goto LAB_00894a72;
        *puVar6 = 0;
      }
      cVar3 = *(charcount_t *)(buffer + 1);
      *value = cVar3;
      if (0xffff0000 < cVar3 - 0x10000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x146,"(*value > ((uint16) 0xffff) || *value <= 0)",
                                    "*value > TWO_BYTE_MAX || *value <= 0");
        if (!bVar5) goto LAB_00894a72;
        *puVar6 = 0;
      }
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015d3490,VariableIntEncodingPhase);
      lVar7 = 5;
      if (!bVar5) goto LAB_00894a5d;
      form = L"TestTrace: VariableIntEncoding (decode) - 4 bytes, value %u\n";
    }
  }
  Output::Print(form,(ulong)*value);
  Output::Flush();
LAB_00894a5d:
  return buffer + lVar7;
}

Assistant:

const byte * ReadCharCount(const byte * buffer, size_t remainingBytes, charcount_t * value)
    {
#if VARIABLE_INT_ENCODING
        return ReadVariableInt<charcount_t>(buffer, remainingBytes, value);
#else
        Assert(remainingBytes >= sizeof(charcount_t));
        *value = *(charcount_t *) buffer;
        return buffer + sizeof(charcount_t);
#endif
    }